

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_text_read.cpp
# Opt level: O1

bool __thiscall
ritobin::io::impl_text_read::BinTextReader::process_list_fields(BinTextReader *this,FieldList *list)

{
  char *pcVar1;
  bool bVar2;
  char *start;
  
  TextReader::next_newline(&this->reader);
  while( true ) {
    pcVar1 = (this->reader).cur_;
    if (pcVar1 == (this->reader).cap_) {
      return true;
    }
    bVar2 = read_field(this,list);
    if (!bVar2) break;
    pcVar1 = (this->reader).cur_;
    if (pcVar1 == (this->reader).cap_) {
      bVar2 = true;
    }
    else {
      bVar2 = TextReader::read_nested_separator(&this->reader);
    }
    if (bVar2 == false) {
      bVar2 = fail_msg(this,"reader.read_nested_separator_or_eof()",pcVar1);
      return bVar2;
    }
  }
  bVar2 = fail_msg(this,"read_field(list)",pcVar1);
  return bVar2;
}

Assistant:

bool process_list_fields(FieldList& list) noexcept {
            reader.next_newline();
            while (!reader.is_eof()) {
                bin_assert(read_field(list));
                bin_assert(reader.read_nested_separator_or_eof());
            }
            return true;
        }